

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(void)

{
  int iVar1;
  istream *this;
  long *plVar2;
  int iVar3;
  int m;
  int n;
  int x;
  stack<int> b;
  stack<int> a;
  int local_5c;
  int local_58;
  int local_54;
  stack<int> local_50;
  stack<int> local_38;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105160) = 0;
  local_38.mData = (int *)operator_new__(4);
  *local_38.mData = 0;
  local_38.mCap = 1;
  local_38.mSize = 0;
  local_50.mData = (int *)operator_new__(4);
  *local_50.mData = 0;
  local_50.mCap = 1;
  local_50.mSize = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_58);
  std::istream::operator>>(this,&local_5c);
  if (0 < local_58) {
    iVar3 = 0;
    do {
      std::istream::operator>>((istream *)&std::cin,&local_54);
      CP::stack<int>::push(&local_38,&local_54);
      iVar3 = iVar3 + 1;
    } while (iVar3 < local_58);
  }
  if (0 < local_5c) {
    iVar3 = 0;
    do {
      std::istream::operator>>((istream *)&std::cin,&local_54);
      CP::stack<int>::push(&local_50,&local_54);
      iVar3 = iVar3 + 1;
    } while (iVar3 < local_5c);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"a.compare_reserve(b) = ",0x17);
  iVar1 = ((int)local_38.mCap - ((int)local_38.mSize + (int)local_50.mCap)) + (int)local_50.mSize;
  iVar3 = 1;
  if (iVar1 < 1) {
    iVar3 = iVar1 >> 0x1f;
  }
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"b.compare_reserve(a) = ",0x17);
  iVar1 = ((int)local_50.mCap - ((int)local_50.mSize + (int)local_38.mCap)) + (int)local_38.mSize;
  iVar3 = 1;
  if (iVar1 < 1) {
    iVar3 = iVar1 >> 0x1f;
  }
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  if (local_50.mData != (int *)0x0) {
    operator_delete__(local_50.mData);
  }
  if (local_38.mData != (int *)0x0) {
    operator_delete__(local_38.mData);
  }
  return 0;
}

Assistant:

int main()
{
    std::ios_base::sync_with_stdio(false);std::cin.tie(0);

    int n,m;
    CP::stack<int> a,b;
    std::cin >> n >> m;
    for (int i = 0;i < n;i++) {
        int x;
        std::cin >> x;
        a.push(x);
    }
    for (int i = 0;i < m;i++) {
        int x;
        std::cin >> x;
        b.push(x);
    }
    std::cout << "a.compare_reserve(b) = " << a.compare_reserve(b) << std::endl;
    std::cout << "b.compare_reserve(a) = " << b.compare_reserve(a) << std::endl;
}